

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_scan_avx2_256_16.c
# Opt level: O2

parasail_result_t *
parasail_sg_flags_table_scan_profile_avx2_256_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  __m256i *palVar1;
  ushort uVar2;
  uint uVar3;
  void *pvVar4;
  parasail_matrix_t *ppVar5;
  int *piVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  __m256i alVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  short sVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  parasail_result_t *ppVar17;
  __m256i *ptr;
  int16_t *ptr_00;
  __m256i *ptr_01;
  __m256i *ptr_02;
  __m256i *ptr_03;
  uint uVar18;
  ulong size;
  char *pcVar19;
  int16_t iVar20;
  long lVar21;
  ulong uVar22;
  int iVar23;
  undefined4 uVar24;
  int iVar25;
  uint uVar26;
  char *__format;
  ulong uVar27;
  ushort uVar28;
  long lVar29;
  undefined4 uVar30;
  long lVar31;
  uint uVar32;
  long lVar33;
  uint uVar34;
  long lVar35;
  bool bVar36;
  undefined2 uVar37;
  undefined1 auVar38 [16];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [64];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [64];
  undefined1 auVar47 [16];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  __m256i_16_t e;
  __m256i_16_t h;
  int local_188;
  long local_f0;
  int local_e8;
  longlong local_a0;
  longlong lStack_98;
  longlong lStack_90;
  longlong lStack_88;
  longlong local_80;
  longlong lStack_78;
  longlong lStack_70;
  longlong lStack_68;
  undefined1 auVar39 [32];
  
  if (profile == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar19 = "profile";
  }
  else {
    pvVar4 = (profile->profile16).score;
    if (pvVar4 == (void *)0x0) {
      __format = "%s: missing %s\n";
      pcVar19 = "profile->profile16.score";
    }
    else {
      ppVar5 = profile->matrix;
      if (ppVar5 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
        pcVar19 = "profile->matrix";
      }
      else {
        uVar3 = profile->s1Len;
        if ((int)uVar3 < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar19 = "profile->s1Len";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
          pcVar19 = "s2";
        }
        else {
          uVar22 = (ulong)(uint)s2Len;
          if (s2Len < 1) {
            __format = "%s: %s must be > 0\n";
            pcVar19 = "s2Len";
          }
          else if (open < 0) {
            __format = "%s: %s must be >= 0\n";
            pcVar19 = "open";
          }
          else {
            if (-1 < gap) {
              uVar34 = uVar3 - 1;
              size = (ulong)uVar3 + 0xf >> 4;
              iVar23 = -open;
              iVar14 = ppVar5->min;
              iVar25 = -iVar14;
              if (iVar14 != iVar23 && SBORROW4(iVar14,iVar23) == iVar14 + open < 0) {
                iVar25 = open;
              }
              sVar13 = 0x7ffe - (short)ppVar5->max;
              ppVar17 = parasail_result_new_table1((uint)((ulong)uVar3 + 0xf) & 0x7ffffff0,s2Len);
              if (ppVar17 != (parasail_result_t *)0x0) {
                ppVar17->flag =
                     (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 |
                     (uint)(s2_beg != 0) << 0xe | (uint)(s2_end != 0) << 0xf | ppVar17->flag |
                     0x10220402;
                ptr = parasail_memalign___m256i(0x20,size);
                ptr_00 = parasail_memalign_int16_t(0x20,(ulong)(s2Len + 1));
                ptr_01 = parasail_memalign___m256i(0x20,size);
                ptr_02 = parasail_memalign___m256i(0x20,size);
                ptr_03 = parasail_memalign___m256i(0x20,size);
                if (ptr_03 != (__m256i *)0x0 &&
                    ((ptr_02 != (__m256i *)0x0 && ptr_01 != (__m256i *)0x0) &&
                    (ptr_00 != (int16_t *)0x0 && ptr != (__m256i *)0x0))) {
                  iVar14 = s2Len + -1;
                  iVar15 = 0xf - (int)(uVar34 / size);
                  uVar37 = (undefined2)open;
                  auVar43._2_2_ = uVar37;
                  auVar43._0_2_ = uVar37;
                  auVar43._4_2_ = uVar37;
                  auVar43._6_2_ = uVar37;
                  auVar43._8_2_ = uVar37;
                  auVar43._10_2_ = uVar37;
                  auVar43._12_2_ = uVar37;
                  auVar43._14_2_ = uVar37;
                  auVar43._16_2_ = uVar37;
                  auVar43._18_2_ = uVar37;
                  auVar43._20_2_ = uVar37;
                  auVar43._22_2_ = uVar37;
                  auVar43._24_2_ = uVar37;
                  auVar43._26_2_ = uVar37;
                  auVar43._28_2_ = uVar37;
                  auVar43._30_2_ = uVar37;
                  uVar37 = (undefined2)gap;
                  auVar44._2_2_ = uVar37;
                  auVar44._0_2_ = uVar37;
                  auVar44._4_2_ = uVar37;
                  auVar44._6_2_ = uVar37;
                  auVar44._8_2_ = uVar37;
                  auVar44._10_2_ = uVar37;
                  auVar44._12_2_ = uVar37;
                  auVar44._14_2_ = uVar37;
                  auVar44._16_2_ = uVar37;
                  auVar44._18_2_ = uVar37;
                  auVar44._20_2_ = uVar37;
                  auVar44._22_2_ = uVar37;
                  auVar44._24_2_ = uVar37;
                  auVar44._26_2_ = uVar37;
                  auVar44._28_2_ = uVar37;
                  auVar44._30_2_ = uVar37;
                  uVar32 = iVar25 - 0x7fff;
                  auVar38._0_2_ = (undefined2)uVar32;
                  auVar38._2_2_ = auVar38._0_2_;
                  auVar38._4_2_ = auVar38._0_2_;
                  auVar38._6_2_ = auVar38._0_2_;
                  auVar38._8_2_ = auVar38._0_2_;
                  auVar38._10_2_ = auVar38._0_2_;
                  auVar38._12_2_ = auVar38._0_2_;
                  auVar38._14_2_ = auVar38._0_2_;
                  auVar39._16_2_ = auVar38._0_2_;
                  auVar39._0_16_ = auVar38;
                  auVar39._18_2_ = auVar38._0_2_;
                  auVar39._20_2_ = auVar38._0_2_;
                  auVar39._22_2_ = auVar38._0_2_;
                  auVar39._24_2_ = auVar38._0_2_;
                  auVar39._26_2_ = auVar38._0_2_;
                  auVar39._28_2_ = auVar38._0_2_;
                  auVar39._30_2_ = auVar38._0_2_;
                  auVar40._2_2_ = sVar13;
                  auVar40._0_2_ = sVar13;
                  auVar40._4_2_ = sVar13;
                  auVar40._6_2_ = sVar13;
                  auVar40._8_2_ = sVar13;
                  auVar40._10_2_ = sVar13;
                  auVar40._12_2_ = sVar13;
                  auVar40._14_2_ = sVar13;
                  auVar40._16_2_ = sVar13;
                  auVar40._18_2_ = sVar13;
                  auVar40._20_2_ = sVar13;
                  auVar40._22_2_ = sVar13;
                  auVar40._24_2_ = sVar13;
                  auVar40._26_2_ = sVar13;
                  auVar40._28_2_ = sVar13;
                  auVar40._30_2_ = sVar13;
                  uVar37 = (undefined2)iVar15;
                  auVar45._2_2_ = uVar37;
                  auVar45._0_2_ = uVar37;
                  auVar45._4_2_ = uVar37;
                  auVar45._6_2_ = uVar37;
                  auVar45._8_2_ = uVar37;
                  auVar45._10_2_ = uVar37;
                  auVar45._12_2_ = uVar37;
                  auVar45._14_2_ = uVar37;
                  auVar45._16_2_ = uVar37;
                  auVar45._18_2_ = uVar37;
                  auVar45._20_2_ = uVar37;
                  auVar45._22_2_ = uVar37;
                  auVar45._24_2_ = uVar37;
                  auVar45._26_2_ = uVar37;
                  auVar45._28_2_ = uVar37;
                  auVar45._30_2_ = uVar37;
                  uVar16 = (uint)size;
                  auVar41._0_2_ = (undefined2)-(uVar16 * gap);
                  auVar41._2_2_ = auVar41._0_2_;
                  auVar41._4_2_ = auVar41._0_2_;
                  auVar41._6_2_ = auVar41._0_2_;
                  auVar41._8_2_ = auVar41._0_2_;
                  auVar41._10_2_ = auVar41._0_2_;
                  auVar41._12_2_ = auVar41._0_2_;
                  auVar41._14_2_ = auVar41._0_2_;
                  auVar41._16_2_ = auVar41._0_2_;
                  auVar41._18_2_ = auVar41._0_2_;
                  auVar41._20_2_ = auVar41._0_2_;
                  auVar41._22_2_ = auVar41._0_2_;
                  auVar41._24_2_ = auVar41._0_2_;
                  auVar41._26_2_ = auVar41._0_2_;
                  auVar41._28_2_ = auVar41._0_2_;
                  auVar41._30_2_ = auVar41._0_2_;
                  auVar41 = vpand_avx2(auVar41,_DAT_008a5920);
                  auVar41 = vpaddsw_avx2(ZEXT432(uVar32 & 0xffff),auVar41);
                  lVar21 = (long)iVar23;
                  for (uVar27 = 0; uVar27 != size; uVar27 = uVar27 + 1) {
                    lVar29 = lVar21;
                    for (lVar31 = 0; lVar31 != 0x10; lVar31 = lVar31 + 1) {
                      lVar35 = lVar29;
                      if (s1_beg != 0) {
                        lVar35 = 0;
                      }
                      lVar33 = -0x8000;
                      if (-0x8000 < lVar35) {
                        lVar33 = lVar35;
                      }
                      lVar35 = lVar35 - (ulong)(uint)open;
                      if (lVar35 < -0x7fff) {
                        lVar35 = -0x8000;
                      }
                      *(short *)((long)&local_80 + lVar31 * 2) = (short)lVar33;
                      *(short *)((long)&local_a0 + lVar31 * 2) = (short)lVar35;
                      lVar29 = lVar29 - size * (uint)gap;
                    }
                    palVar1 = ptr_02 + uVar27;
                    (*palVar1)[0] = local_80;
                    (*palVar1)[1] = lStack_78;
                    (*palVar1)[2] = lStack_70;
                    (*palVar1)[3] = lStack_68;
                    palVar1 = ptr + uVar27;
                    (*palVar1)[0] = local_a0;
                    (*palVar1)[1] = lStack_98;
                    (*palVar1)[2] = lStack_90;
                    (*palVar1)[3] = lStack_88;
                    lVar21 = lVar21 - (ulong)(uint)gap;
                  }
                  *ptr_00 = 0;
                  for (uVar27 = 1; s2Len + 1 != uVar27; uVar27 = uVar27 + 1) {
                    iVar20 = -0x8000;
                    if (-0x8000 < iVar23) {
                      iVar20 = (int16_t)iVar23;
                    }
                    if (s2_beg != 0) {
                      iVar20 = 0;
                    }
                    ptr_00[uVar27] = iVar20;
                    iVar23 = iVar23 - gap;
                  }
                  alVar9 = (__m256i)vpsubsw_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar43)
                  ;
                  auVar8 = auVar40;
                  for (uVar18 = uVar16 - 1; auVar42 = ZEXT3264(auVar8), -1 < (int)uVar18;
                      uVar18 = uVar18 - 1) {
                    ptr_03[uVar18] = alVar9;
                    alVar9 = (__m256i)vpsubsw_avx2((undefined1  [32])alVar9,auVar44);
                    auVar8 = vpminsw_avx2((undefined1  [32])alVar9,auVar8);
                  }
                  lVar21 = size * uVar22;
                  auVar8 = vpcmpeqw_avx2(auVar45,_DAT_008a5940);
                  auVar46 = ZEXT3264(auVar39);
                  local_f0 = 0;
                  uVar27 = 0;
                  auVar45 = auVar39;
                  local_188 = iVar14;
                  while (uVar27 != uVar22) {
                    auVar47 = SUB3216(ptr_02[uVar16 - 1],0);
                    auVar48._0_16_ = ZEXT116(0) * auVar47 + ZEXT116(1) * auVar38;
                    auVar48._16_16_ = ZEXT116(0) * auVar39._16_16_ + ZEXT116(1) * auVar47;
                    auVar48 = vpalignr_avx2((undefined1  [32])ptr_02[uVar16 - 1],auVar48,0xe);
                    auVar47 = vpinsrw_avx(auVar48._0_16_,(uint)(ushort)ptr_00[uVar27],0);
                    auVar48 = vpblendd_avx2(auVar48,ZEXT1632(auVar47),0xf);
                    iVar25 = ppVar5->mapper[(byte)s2[uVar27]];
                    auVar10 = vpsubsw_avx2(auVar39,(undefined1  [32])*ptr_03);
                    auVar7 = auVar39;
                    for (lVar29 = 0; size << 5 != lVar29; lVar29 = lVar29 + 0x20) {
                      auVar49 = vpaddsw_avx2(auVar48,*(undefined1 (*) [32])
                                                      ((long)pvVar4 +
                                                      lVar29 + (long)(int)(iVar25 * uVar16) * 0x20))
                      ;
                      auVar48 = *(undefined1 (*) [32])((long)*ptr_02 + lVar29);
                      auVar11 = vpsubsw_avx2(*(undefined1 (*) [32])((long)*ptr + lVar29),auVar44);
                      auVar12 = vpsubsw_avx2(auVar48,auVar43);
                      auVar10 = vpaddsw_avx2(auVar10,*(undefined1 (*) [32])((long)*ptr_03 + lVar29))
                      ;
                      auVar11 = vpmaxsw_avx2(auVar11,auVar12);
                      auVar7 = vpmaxsw_avx2(auVar7,auVar10);
                      *(undefined1 (*) [32])((long)*ptr + lVar29) = auVar11;
                      auVar10 = vpmaxsw_avx2(auVar11,auVar49);
                      *(undefined1 (*) [32])((long)*ptr_01 + lVar29) = auVar10;
                    }
                    auVar49._0_16_ = ZEXT116(0) * auVar10._0_16_ + ZEXT116(1) * auVar38;
                    auVar49._16_16_ = ZEXT116(0) * auVar39._16_16_ + ZEXT116(1) * auVar10._0_16_;
                    auVar48 = vpalignr_avx2(auVar10,auVar49,0xe);
                    auVar47 = vpinsrw_avx(auVar48._0_16_,(uint)(ushort)ptr_00[uVar27 + 1],0);
                    auVar10 = vpblendd_avx2(auVar48,ZEXT1632(auVar47),0xf);
                    auVar48 = vpaddsw_avx2(auVar10,(undefined1  [32])*ptr_03);
                    auVar48 = vpmaxsw_avx2(auVar7,auVar48);
                    iVar25 = 0xe;
                    while( true ) {
                      auVar7 = vperm2i128_avx2(auVar48,auVar48,8);
                      auVar7 = vpalignr_avx2(auVar48,auVar7,0xe);
                      bVar36 = iVar25 == 0;
                      iVar25 = iVar25 + -1;
                      if (bVar36) break;
                      auVar7 = vpaddsw_avx2(auVar7,auVar41);
                      auVar48 = vpmaxsw_avx2(auVar48,auVar7);
                    }
                    auVar48 = vpaddsw_avx2(auVar7,ZEXT432(uVar32 & 0xffff));
                    auVar7 = vpmaxsw_avx2(auVar10,auVar48);
                    lVar29 = local_f0;
                    for (lVar31 = 0; size << 5 != lVar31; lVar31 = lVar31 + 0x20) {
                      auVar48 = vpsubsw_avx2(auVar48,auVar44);
                      auVar7 = vpsubsw_avx2(auVar7,auVar43);
                      auVar48 = vpmaxsw_avx2(auVar48,auVar7);
                      auVar7 = vpmaxsw_avx2(auVar48,*(undefined1 (*) [32])((long)*ptr_01 + lVar31));
                      *(undefined1 (*) [32])((long)*ptr_02 + lVar31) = auVar7;
                      piVar6 = ((ppVar17->field_4).rowcols)->score_row;
                      *(int *)((long)piVar6 + lVar29) = (int)auVar7._0_2_;
                      auVar47 = auVar7._0_16_;
                      uVar24 = vpextrw_avx(auVar47,1);
                      uVar30 = vpextrw_avx(auVar47,2);
                      *(int *)((long)piVar6 + lVar21 * 4 + lVar29) = (int)(short)uVar24;
                      uVar24 = vpextrw_avx(auVar47,3);
                      *(int *)((long)piVar6 + lVar21 * 8 + lVar29) = (int)(short)uVar30;
                      uVar30 = vpextrw_avx(auVar47,4);
                      *(int *)((long)piVar6 + lVar21 * 0xc + lVar29) = (int)(short)uVar24;
                      uVar24 = vpextrw_avx(auVar47,5);
                      *(int *)((long)piVar6 + lVar21 * 0x10 + lVar29) = (int)(short)uVar30;
                      uVar30 = vpextrw_avx(auVar47,6);
                      *(int *)((long)piVar6 + lVar21 * 0x14 + lVar29) = (int)(short)uVar24;
                      uVar24 = vpextrw_avx(auVar47,7);
                      *(int *)((long)piVar6 + lVar21 * 0x18 + lVar29) = (int)(short)uVar30;
                      *(int *)((long)piVar6 + lVar21 * 0x1c + lVar29) = (int)(short)uVar24;
                      auVar47 = auVar7._16_16_;
                      uVar24 = vpextrw_avx(auVar47,1);
                      *(int *)((long)piVar6 + lVar21 * 0x20 + lVar29) = (int)auVar7._16_2_;
                      uVar30 = vpextrw_avx(auVar47,2);
                      *(int *)((long)piVar6 + lVar21 * 0x24 + lVar29) = (int)(short)uVar24;
                      uVar24 = vpextrw_avx(auVar47,3);
                      *(int *)((long)piVar6 + lVar21 * 0x28 + lVar29) = (int)(short)uVar30;
                      uVar30 = vpextrw_avx(auVar47,4);
                      *(int *)((long)piVar6 + lVar21 * 0x2c + lVar29) = (int)(short)uVar24;
                      uVar24 = vpextrw_avx(auVar47,5);
                      *(int *)((long)piVar6 + lVar21 * 0x30 + lVar29) = (int)(short)uVar30;
                      uVar30 = vpextrw_avx(auVar47,6);
                      *(int *)((long)piVar6 + lVar21 * 0x34 + lVar29) = (int)(short)uVar24;
                      uVar24 = vpextrw_avx(auVar47,7);
                      *(int *)((long)piVar6 + lVar21 * 0x38 + lVar29) = (int)(short)uVar30;
                      *(int *)((long)piVar6 + lVar21 * 0x3c + lVar29) = (int)(short)uVar24;
                      auVar10 = vpminsw_avx2(auVar48,auVar42._0_32_);
                      auVar10 = vpminsw_avx2(auVar7,auVar10);
                      auVar42 = ZEXT3264(auVar10);
                      auVar10 = vpmaxsw_avx2(auVar7,auVar46._0_32_);
                      auVar46 = ZEXT3264(auVar10);
                      lVar29 = lVar29 + uVar22 * 4;
                    }
                    alVar9 = ptr_02[(ulong)uVar34 % size];
                    auVar48 = vpcmpgtw_avx2((undefined1  [32])alVar9,auVar45);
                    auVar48 = vpand_avx2(auVar48,auVar8);
                    auVar45 = vpmaxsw_avx2((undefined1  [32])alVar9,auVar45);
                    local_e8 = (int)uVar27;
                    if ((((((((((((((((((((((((((((((((auVar48 >> 7 & (undefined1  [32])0x1) !=
                                                      (undefined1  [32])0x0 ||
                                                     (auVar48 >> 0xf & (undefined1  [32])0x1) !=
                                                     (undefined1  [32])0x0) ||
                                                    (auVar48 >> 0x17 & (undefined1  [32])0x1) !=
                                                    (undefined1  [32])0x0) ||
                                                   (auVar48 >> 0x1f & (undefined1  [32])0x1) !=
                                                   (undefined1  [32])0x0) ||
                                                  (auVar48 >> 0x27 & (undefined1  [32])0x1) !=
                                                  (undefined1  [32])0x0) ||
                                                 (auVar48 >> 0x2f & (undefined1  [32])0x1) !=
                                                 (undefined1  [32])0x0) ||
                                                (auVar48 >> 0x37 & (undefined1  [32])0x1) !=
                                                (undefined1  [32])0x0) ||
                                               (auVar48 >> 0x3f & (undefined1  [32])0x1) !=
                                               (undefined1  [32])0x0) ||
                                              (auVar48 >> 0x47 & (undefined1  [32])0x1) !=
                                              (undefined1  [32])0x0) ||
                                             (auVar48 >> 0x4f & (undefined1  [32])0x1) !=
                                             (undefined1  [32])0x0) ||
                                            (auVar48 >> 0x57 & (undefined1  [32])0x1) !=
                                            (undefined1  [32])0x0) ||
                                           (auVar48 >> 0x5f & (undefined1  [32])0x1) !=
                                           (undefined1  [32])0x0) ||
                                          (auVar48 >> 0x67 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0) ||
                                         (auVar48 >> 0x6f & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar48 >> 0x77 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) || SUB321(auVar48 >> 0x7f,0) != '\0')
                                      || (auVar48 >> 0x87 & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                     (auVar48 >> 0x8f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (auVar48 >> 0x97 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (auVar48 >> 0x9f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar48 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || (auVar48 >> 0xaf & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                (auVar48 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || SUB321(auVar48 >> 0xbf,0) != '\0') ||
                              (auVar48 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                             (auVar48 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar48 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           (auVar48 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar48 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar48 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar48 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        auVar48[0x1f] < '\0') {
                      local_188 = local_e8;
                    }
                    local_f0 = local_f0 + 4;
                    uVar27 = uVar27 + 1;
                  }
                  if (s2_end != 0) {
                    for (iVar25 = 0; iVar25 < iVar15; iVar25 = iVar25 + 1) {
                      auVar41 = vperm2i128_avx2(auVar45,auVar45,0x28);
                      auVar45 = vpalignr_avx2(auVar45,auVar41,0xe);
                    }
                    uVar32 = vpextrw_avx(auVar45._16_16_,7);
                  }
                  uVar28 = (ushort)uVar32;
                  uVar18 = uVar34;
                  if (s1_end != 0) {
                    uVar22 = 0;
                    while( true ) {
                      uVar28 = (ushort)uVar32;
                      if ((uVar16 & 0x7ffffff) << 4 == (uint)uVar22) break;
                      uVar26 = ((uint)uVar22 & 0xf) * uVar16 + ((uint)(uVar22 >> 4) & 0xfffffff);
                      if ((int)uVar26 < (int)uVar3) {
                        uVar2 = *(ushort *)((long)*ptr_02 + uVar22 * 2);
                        if ((short)uVar28 < (short)uVar2) {
                          uVar32 = (uint)uVar2;
                          uVar18 = uVar26;
                          local_188 = iVar14;
                        }
                        else {
                          if ((int)uVar18 <= (int)uVar26) {
                            uVar26 = uVar18;
                          }
                          if (local_188 != iVar14) {
                            uVar26 = uVar18;
                          }
                          if (uVar2 == uVar28) {
                            uVar18 = uVar26;
                          }
                        }
                      }
                      uVar22 = uVar22 + 1;
                    }
                  }
                  if (s2_end == 0 && s1_end == 0) {
                    alVar9 = ptr_02[(ulong)uVar34 % size];
                    for (iVar25 = 0; iVar25 < iVar15; iVar25 = iVar25 + 1) {
                      auVar41 = vperm2i128_avx2((undefined1  [32])alVar9,(undefined1  [32])alVar9,
                                                0x28);
                      alVar9 = (__m256i)vpalignr_avx2((undefined1  [32])alVar9,auVar41,0xe);
                    }
                    uVar24 = vpextrw_avx(alVar9._16_16_,7);
                    uVar28 = (ushort)uVar24;
                    uVar18 = uVar34;
                    local_188 = iVar14;
                  }
                  auVar41 = vpcmpgtw_avx2(auVar39,auVar42._0_32_);
                  auVar39 = vpcmpgtw_avx2(auVar46._0_32_,auVar40);
                  auVar41 = vpor_avx2(auVar39,auVar41);
                  if ((((((((((((((((((((((((((((((((auVar41 >> 7 & (undefined1  [32])0x1) !=
                                                    (undefined1  [32])0x0 ||
                                                   (auVar41 >> 0xf & (undefined1  [32])0x1) !=
                                                   (undefined1  [32])0x0) ||
                                                  (auVar41 >> 0x17 & (undefined1  [32])0x1) !=
                                                  (undefined1  [32])0x0) ||
                                                 (auVar41 >> 0x1f & (undefined1  [32])0x1) !=
                                                 (undefined1  [32])0x0) ||
                                                (auVar41 >> 0x27 & (undefined1  [32])0x1) !=
                                                (undefined1  [32])0x0) ||
                                               (auVar41 >> 0x2f & (undefined1  [32])0x1) !=
                                               (undefined1  [32])0x0) ||
                                              (auVar41 >> 0x37 & (undefined1  [32])0x1) !=
                                              (undefined1  [32])0x0) ||
                                             (auVar41 >> 0x3f & (undefined1  [32])0x1) !=
                                             (undefined1  [32])0x0) ||
                                            (auVar41 >> 0x47 & (undefined1  [32])0x1) !=
                                            (undefined1  [32])0x0) ||
                                           (auVar41 >> 0x4f & (undefined1  [32])0x1) !=
                                           (undefined1  [32])0x0) ||
                                          (auVar41 >> 0x57 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0) ||
                                         (auVar41 >> 0x5f & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar41 >> 0x67 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (auVar41 >> 0x6f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar41 >> 0x77 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) || SUB321(auVar41 >> 0x7f,0) != '\0')
                                    || (auVar41 >> 0x87 & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                   (auVar41 >> 0x8f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar41 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || (auVar41 >> 0x9f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                (auVar41 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || (auVar41 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar41 >> 0xb7 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar41 >> 0xbf,0) != '\0') ||
                            (auVar41 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           (auVar41 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar41 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar41 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar41 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar41 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar41 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      auVar41[0x1f] < '\0') {
                    *(byte *)&ppVar17->flag = (byte)ppVar17->flag | 0x40;
                    uVar28 = 0;
                    local_188 = 0;
                    uVar18 = 0;
                  }
                  ppVar17->score = (int)(short)uVar28;
                  ppVar17->end_query = uVar18;
                  ppVar17->end_ref = local_188;
                  parasail_free(ptr_03);
                  parasail_free(ptr_02);
                  parasail_free(ptr_01);
                  parasail_free(ptr_00);
                  parasail_free(ptr);
                  return ppVar17;
                }
              }
              return (parasail_result_t *)0x0;
            }
            __format = "%s: %s must be >= 0\n";
            pcVar19 = "gap";
          }
        }
      }
    }
  }
  fprintf(_stderr,__format,"parasail_sg_flags_table_scan_profile_avx2_256_16",pcVar19);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m256i* restrict pvP = NULL;
    __m256i* restrict pvE = NULL;
    int16_t* restrict boundary = NULL;
    __m256i* restrict pvHt = NULL;
    __m256i* restrict pvH = NULL;
    __m256i* restrict pvGapper = NULL;
    __m256i vGapO;
    __m256i vGapE;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    __m256i vZero;
    int16_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vMaxH;
    __m256i vPosMask;
    __m256i vNegInfFront;
    __m256i vSegLenXgap;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 16; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP = (__m256i*)profile->profile16.score;
    vGapO = _mm256_set1_epi16(open);
    vGapE = _mm256_set1_epi16(gap);
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    vZero = _mm256_setzero_si256();
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vPosMask = _mm256_cmpeq_epi16(_mm256_set1_epi16(position),
            _mm256_set_epi16(0,1,2,3,4,5,6,7,8,9,10,11,12,13,14,15));
    vNegInfFront = vZero;
    vNegInfFront = _mm256_insert_epi16_rpl(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm256_adds_epi16(vNegInfFront,
            _mm256_slli_si256_rpl(_mm256_set1_epi16(-segLen*gap), 2));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_16;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE = parasail_memalign___m256i(32, segLen);
    boundary = parasail_memalign_int16_t(32, s2Len+1);
    pvHt= parasail_memalign___m256i(32, segLen);
    pvH = parasail_memalign___m256i(32, segLen);
    pvGapper = parasail_memalign___m256i(32, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!boundary) return NULL;
    if (!pvHt) return NULL;
    if (!pvH) return NULL;
    if (!pvGapper) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m256i_16_t h;
            __m256i_16_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
            }
            _mm256_store_si256(&pvH[index], h.m);
            _mm256_store_si256(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT16_MIN ? INT16_MIN : tmp;
        }
    }

    {
        __m256i vGapper = _mm256_subs_epi16(vZero,vGapO);
        for (i=segLen-1; i>=0; --i) {
            _mm256_store_si256(pvGapper+i, vGapper);
            vGapper = _mm256_subs_epi16(vGapper, vGapE);
            /* long queries and/or large penalties will break the pseudo prefix scan */
            vSaturationCheckMin = _mm256_min_epi16(vSaturationCheckMin, vGapper);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        __m256i vHt;
        __m256i vF;
        __m256i vH;
        __m256i vHp;
        __m256i *pvW;
        __m256i vW;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm256_load_si256(pvH+(segLen-1));
        vHp = _mm256_slli_si256_rpl(vHp, 2);
        vHp = _mm256_insert_epi16_rpl(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm256_subs_epi16(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        for (i=0; i<segLen; ++i) {
            vH = _mm256_load_si256(pvH+i);
            vE = _mm256_load_si256(pvE+i);
            vW = _mm256_load_si256(pvW+i);
            vE = _mm256_max_epi16(
                    _mm256_subs_epi16(vE, vGapE),
                    _mm256_subs_epi16(vH, vGapO));
            vHp = _mm256_adds_epi16(vHp, vW);
            vF = _mm256_max_epi16(vF, _mm256_adds_epi16(vHt, pvGapper[i]));
            vHt = _mm256_max_epi16(vE, vHp);
            _mm256_store_si256(pvE+i, vE);
            _mm256_store_si256(pvHt+i, vHt);
            vHp = vH;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm256_slli_si256_rpl(vHt, 2);
        vHt = _mm256_insert_epi16_rpl(vHt, boundary[j+1], 0);
        vF = _mm256_max_epi16(vF, _mm256_adds_epi16(vHt, pvGapper[0]));
        for (i=0; i<segWidth-2; ++i) {
            __m256i vFt = _mm256_slli_si256_rpl(vF, 2);
            vFt = _mm256_adds_epi16(vFt, vSegLenXgap);
            vF = _mm256_max_epi16(vF, vFt);
        }

        /* calculate final H */
        vF = _mm256_slli_si256_rpl(vF, 2);
        vF = _mm256_adds_epi16(vF, vNegInfFront);
        vH = _mm256_max_epi16(vHt, vF);
        for (i=0; i<segLen; ++i) {
            vHt = _mm256_load_si256(pvHt+i);
            vF = _mm256_max_epi16(
                    _mm256_subs_epi16(vF, vGapE),
                    _mm256_subs_epi16(vH, vGapO));
            vH = _mm256_max_epi16(vHt, vF);
            _mm256_store_si256(pvH+i, vH);
            vSaturationCheckMin = _mm256_min_epi16(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm256_min_epi16(vSaturationCheckMin, vF);
            vSaturationCheckMax = _mm256_max_epi16(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
        } 

        /* extract vector containing last value from column */
        {
            __m256i vCompare;
            vH = _mm256_load_si256(pvH + offset);
            vCompare = _mm256_and_si256(vPosMask, _mm256_cmpgt_epi16(vH, vMaxH));
            vMaxH = _mm256_max_epi16(vH, vMaxH);
            if (_mm256_movemask_epi8(vCompare)) {
                end_ref = j;
            }
#ifdef PARASAIL_ROWCOL
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 2);
            }
            result->rowcols->score_row[j] = (int16_t) _mm256_extract_epi16_rpl (vH, 15);
#endif
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvH + i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* max last value from all columns */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm256_slli_si256_rpl(vMaxH, 2);
        }
        score = (int16_t) _mm256_extract_epi16_rpl(vMaxH, 15);
        end_query = s1Len-1;
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int16_t *t = (int16_t*)pvH;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
            }
        }
    }

    if (!s1_end && !s2_end) {
        /* extract last value from the last column */
        {
            __m256i vH = _mm256_load_si256(pvH + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 2);
            }
            score = (int16_t) _mm256_extract_epi16_rpl (vH, 15);
            end_ref = s2Len - 1;
            end_query = s1Len - 1;
        }
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi16_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvGapper);
    parasail_free(pvH);
    parasail_free(pvHt);
    parasail_free(boundary);
    parasail_free(pvE);

    return result;
}